

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

optional<unsigned_int>
slang::ast::evalEffectiveWidth(ASTContext *context,Expression *expr,TokenKind keyword)

{
  bool bVar1;
  bitwidth_t bVar2;
  _Optional_payload_base<unsigned_int> _Var3;
  SVInt *this;
  uint *puVar4;
  short in_DX;
  optional<unsigned_int> width;
  ConstantValue cv;
  Expression *in_stack_00000300;
  ASTContext *in_stack_00000308;
  uint *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint uVar5;
  ConstantValue *in_stack_ffffffffffffff78;
  _Optional_payload_base<unsigned_int> local_8;
  
  ASTContext::tryEval(in_stack_00000308,in_stack_00000300);
  _Var3 = (_Optional_payload_base<unsigned_int>)
          slang::ConstantValue::getEffectiveWidth(in_stack_ffffffffffffff78);
  bVar1 = std::optional::operator_cast_to_bool((optional<unsigned_int> *)0xba9686);
  if (bVar1) {
    if (in_DX == 0x74) {
      std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0xba96d6);
      this = slang::ConstantValue::integer((ConstantValue *)0xba96e6);
      SVInt::countLeadingUnknowns(this);
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff58);
      _Var3 = local_8;
    }
    else if (in_DX == 0x75) {
      puVar4 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0xba973c);
      uVar5 = *puVar4;
      slang::ConstantValue::integer((ConstantValue *)0xba974c);
      bVar2 = SVInt::countLeadingZs((SVInt *)in_stack_ffffffffffffff78);
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                ((optional<unsigned_int> *)CONCAT44(uVar5,bVar2),in_stack_ffffffffffffff58);
      _Var3 = local_8;
    }
  }
  else {
    std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_8);
    _Var3 = local_8;
  }
  local_8 = _Var3;
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xba97ac);
  return (optional<unsigned_int>)local_8;
}

Assistant:

static std::optional<bitwidth_t> evalEffectiveWidth(const ASTContext& context,
                                                    const Expression& expr, TokenKind keyword) {
    auto cv = context.tryEval(expr);
    auto width = cv.getEffectiveWidth();
    if (!width)
        return std::nullopt;

    // If the case statement we are evaluating allows wildcards,
    // don't count a wildcard in a top bit as part of the effective
    // width, since it can match zeros.
    if (keyword == TokenKind::CaseXKeyword)
        return *width - cv.integer().countLeadingUnknowns();
    if (keyword == TokenKind::CaseZKeyword)
        return *width - cv.integer().countLeadingZs();
    return width;
}